

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5TextureGatherOffset.cpp
# Opt level: O3

void __thiscall
glcts::GPUShader5TextureGatherOffsetColor2DRepeatCaseTest::prepareVertexBuffersData
          (GPUShader5TextureGatherOffsetColor2DRepeatCaseTest *this,
          vector<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,_std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>_>
          *vertex_buffer_infos)

{
  pointer *ppVVar1;
  int iVar2;
  int iVar3;
  iterator __position;
  GLuint GVar4;
  uint uVar5;
  uint i;
  long lVar6;
  VertexBufferInfo info;
  VertexBufferInfo local_48;
  
  iVar2 = (this->super_GPUShader5TextureGatherOffsetColorTestBase).
          super_GPUShader5TextureGatherOffsetTestBase.m_min_texture_gather_offset;
  iVar3 = (this->super_GPUShader5TextureGatherOffsetColorTestBase).
          super_GPUShader5TextureGatherOffsetTestBase.m_max_texture_gather_offset;
  std::vector<int,_std::allocator<int>_>::resize(&this->m_offsets_buffer_data,0x100);
  TestCaseBase::randomSeed((TestCaseBase *)this,1);
  lVar6 = 0;
  do {
    GVar4 = TestCaseBase::randomFormula((TestCaseBase *)this,(iVar3 - iVar2) + 1);
    local_48.data =
         (this->m_offsets_buffer_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(GLuint *)((long)local_48.data + lVar6 * 4) = GVar4 + iVar2;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  local_48.attribute_name = "offsets";
  local_48.n_components = 2;
  local_48.type = 0x1404;
  uVar5 = *(int *)&(this->m_offsets_buffer_data).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (int)local_48.data;
  local_48.data_size = uVar5 & 0xfffffffc;
  __position._M_current =
       (vertex_buffer_infos->
       super__Vector_base<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,_std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (vertex_buffer_infos->
      super__Vector_base<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,_std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>>
    ::_M_realloc_insert<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo_const&>
              ((vector<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>>
                *)vertex_buffer_infos,__position,&local_48);
  }
  else {
    (__position._M_current)->data = local_48.data;
    *(ulong *)&(__position._M_current)->data_size =
         CONCAT44(local_48._28_4_,uVar5) & 0xfffffffffffffffc;
    (__position._M_current)->attribute_name = "offsets";
    (__position._M_current)->n_components = 2;
    (__position._M_current)->type = 0x1404;
    ppVVar1 = &(vertex_buffer_infos->
               super__Vector_base<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,_std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return;
}

Assistant:

void GPUShader5TextureGatherOffsetColor2DRepeatCaseTest::prepareVertexBuffersData(
	std::vector<VertexBufferInfo>& vertex_buffer_infos)
{
	/* Constats for offsets and size of buffer */
	const unsigned int n_total_components = m_n_vertices * m_n_offsets_components;

	/* Limits used to generate offsets */
	const glw::GLint min_ptgo = m_min_texture_gather_offset;
	const glw::GLint max_ptgo = m_max_texture_gather_offset;

	/* Storage for offsets */
	m_offsets_buffer_data.resize(n_total_components);

	/* Set the seed for random number generator */
	randomSeed(1);

	/* Generate offsets */
	for (unsigned int i = 0; i < n_total_components; ++i)
	{
		m_offsets_buffer_data[i] =
			static_cast<glw::GLint>(randomFormula(static_cast<glw::GLuint>(max_ptgo - min_ptgo + 1))) + min_ptgo;
	}

	/* Setup offsets VB info */
	VertexBufferInfo info;

	info.attribute_name = m_offsets_attribute_name;
	info.n_components   = m_n_offsets_components;
	info.type			= GL_INT;
	info.data			= &m_offsets_buffer_data[0];
	info.data_size		= (glw::GLuint)(m_offsets_buffer_data.size() * sizeof(glw::GLint));

	/* Add VB info to vector */
	vertex_buffer_infos.push_back(info);
}